

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::AsyncCase::verify
          (AsyncCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  _Base_ptr p_Var2;
  int iVar3;
  int iVar4;
  undefined1 in_stack_fffffffffffffde8;
  char local_20c;
  VerificationResult result;
  undefined1 local_1b0 [384];
  
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  de::Mutex::lock(&this->m_mutex);
  this_00 = (ostringstream *)(local_1b0 + 8);
  iVar3 = 0;
  for (p_Var2 = (this->m_counts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_counts)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    BaseCase::verifyMessageCount
              (&result,(BaseCase *)(p_Var2 + 1),(MessageID *)0x1100,*(GLenum *)&p_Var2[1]._M_left,
               *(int *)((long)&p_Var2[1]._M_parent + 4),1,(bool)in_stack_fffffffffffffde8);
    local_20c = (char)ctx;
    if (local_20c != '\0') {
      local_1b0._0_8_ = pTVar1;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,(string *)&result.logMessage);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    iVar4 = iVar3;
    if (iVar3 == 0) {
      iVar4 = 1;
    }
    if (result.result == QP_TEST_RESULT_PASS) {
      iVar4 = iVar3;
    }
    iVar3 = iVar4;
    if (result.result == QP_TEST_RESULT_FAIL) {
      iVar3 = 2;
    }
    BaseCase::VerificationResult::~VerificationResult(&result);
  }
  de::Mutex::unlock(&this->m_mutex);
  return iVar3;
}

Assistant:

AsyncCase::VerifyState AsyncCase::verify (bool uselog)
{
	using std::map;

	VerifyState			retval		= VERIFY_PASS;
	TestLog&			log			= m_testCtx.getLog();

	const de::ScopedLock lock(m_mutex);

	for (map<MessageID, MessageCount>::const_iterator itr = m_counts.begin(); itr != m_counts.end(); itr++)
	{
		const MessageID&	id			= itr->first;

		const int			refCount	= itr->second.expected;
		const int			resCount	= itr->second.received;
		const bool			enabled		= true;

		VerificationResult	result		= verifyMessageCount(id, GL_DONT_CARE, refCount, resCount, enabled);

		if (uselog)
			log << TestLog::Message << result.logMessage << TestLog::EndMessage;

		if (result.result == QP_TEST_RESULT_FAIL)
			retval = VERIFY_FAIL;
		else if (result.result != QP_TEST_RESULT_PASS && retval == VERIFY_PASS)
			retval = VERIFY_MINIMUM;
	}

	return retval;
}